

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O1

void __thiscall
gl4cts::EnhancedLayouts::XFBCaptureStructTest::getShaderInterface
          (XFBCaptureStructTest *this,GLuint test_case_index,STAGES stage,string *out_interface)

{
  char *pcVar1;
  TestError *this_00;
  char *__s;
  bool bVar2;
  
  switch(stage) {
  case VERTEX:
    bVar2 = test_case_index == 0;
    break;
  case TESS_CTRL:
    __s = glcts::fixed_sample_locations_values + 1;
    goto LAB_008bb0a3;
  case TESS_EVAL:
    bVar2 = test_case_index == 1;
    break;
  case GEOMETRY:
    bVar2 = test_case_index == 2;
    break;
  case FRAGMENT:
    __s = 
    "struct Goku {\n    vec4 gohan;\n    vec4 goten;\n    vec4 chichi;\n};\n\nin Goku goku;\n\nout vec4 fs_out;\n"
    ;
    goto LAB_008bb0a3;
  default:
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Invalid enum",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cEnhancedLayoutsTests.cpp"
               ,0x69f1);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  __s = glcts::fixed_sample_locations_values + 1;
  if (bVar2) {
    __s = 
    "const uint sizeof_type = 16;\n\nstruct Goku {\n    vec4 gohan;\n    vec4 goten;\n    vec4 chichi;\n};\n\nlayout (xfb_offset = sizeof_type) out Goku goku;\n\nlayout(binding = 0, std140) uniform block {\n    vec4 uni_gohan;\n    vec4 uni_chichi;\n};\n"
    ;
  }
LAB_008bb0a3:
  pcVar1 = (char *)out_interface->_M_string_length;
  strlen(__s);
  std::__cxx11::string::_M_replace((ulong)out_interface,0,pcVar1,(ulong)__s);
  return;
}

Assistant:

void XFBCaptureStructTest::getShaderInterface(GLuint test_case_index, Utils::Shader::STAGES stage,
											  std::string& out_interface)
{
	static const GLchar* vs_tes_gs = "const uint sizeof_type = 16;\n"
									 "\n"
									 "struct Goku {\n"
									 "    vec4 gohan;\n"
									 "    vec4 goten;\n"
									 "    vec4 chichi;\n"
									 "};\n"
									 "\n"
									 "layout (xfb_offset = sizeof_type) out Goku goku;\n"
									 "\n"
									 "layout(binding = 0, std140) uniform block {\n"
									 "    vec4 uni_gohan;\n"
									 "    vec4 uni_chichi;\n"
									 "};\n";
	static const GLchar* fs = "struct Goku {\n"
							  "    vec4 gohan;\n"
							  "    vec4 goten;\n"
							  "    vec4 chichi;\n"
							  "};\n"
							  "\n"
							  "in Goku goku;\n"
							  "\n"
							  "out vec4 fs_out;\n";

	const GLchar* interface = "";

	switch (stage)
	{
	case Utils::Shader::FRAGMENT:
		interface = fs;
		break;

	case Utils::Shader::GEOMETRY:
		if (TEST_GS == test_case_index)
		{
			interface = vs_tes_gs;
		}
		break;

	case Utils::Shader::TESS_CTRL:
		break;

	case Utils::Shader::TESS_EVAL:
		if (TEST_TES == test_case_index)
		{
			interface = vs_tes_gs;
		}
		break;

	case Utils::Shader::VERTEX:
		if (TEST_VS == test_case_index)
		{
			interface = vs_tes_gs;
		}
		break;

	default:
		TCU_FAIL("Invalid enum");
	}

	out_interface = interface;
}